

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::ProfiledNewScIntArray
              (AuxArray<int> *ints,ScriptContext *scriptContext,ArrayCallSiteInfo *arrayInfo,
              RecyclerWeakReference<Js::FunctionBody> *weakFuncRef)

{
  bool bVar1;
  ThreadContext *pTVar2;
  JavascriptLibrary *lib;
  FunctionBody *functionBody;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  JavascriptNativeArray *this;
  undefined4 *puVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong srcCount;
  SparseArraySegmentBase *pSVar10;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  uVar7 = ints->count;
  srcCount = (ulong)uVar7;
  bVar5 = (arrayInfo->field_0).bits;
  if ((bVar5 & 1) == 0) {
    bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase);
    if (!bVar4) {
      lib = (scriptContext->super_ScriptContextBase).javascriptLibrary;
      functionBody = (FunctionBody *)(weakFuncRef->super_RecyclerWeakReferenceBase).strongRef;
      bVar4 = JavascriptLibrary::IsCopyOnAccessArrayCallSite(lib,arrayInfo,uVar7);
      if (bVar4) {
        if ((lib->cacheForCopyOnAccessArraySegments).ptr == (CacheForCopyOnAccessArraySegments *)0x0
           ) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x3ee,"(lib->cacheForCopyOnAccessArraySegments)",
                                      "lib->cacheForCopyOnAccessArraySegments");
          if (!bVar4) goto LAB_00b6c811;
          *puVar6 = 0;
        }
        this = &JavascriptLibrary::CreateCopyOnAccessNativeIntArrayLiteral
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary,arrayInfo,
                           functionBody,ints)->super_JavascriptNativeArray;
      }
      else {
        this = &JavascriptLibrary::CreateNativeIntArrayLiteral
                          ((scriptContext->super_ScriptContextBase).javascriptLibrary,uVar7)->
                super_JavascriptNativeArray;
        pSVar10 = (((JavascriptNativeArray *)&this->super_JavascriptArray)->super_JavascriptArray).
                  head.ptr;
        if ((uVar7 == 0) || (uVar7 != pSVar10->length)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x3f6,"(count > 0 && count == head->length)",
                                      "count > 0 && count == head->length");
          if (!bVar4) goto LAB_00b6c811;
          *puVar6 = 0;
          uVar7 = pSVar10->length;
        }
        Memory::CopyArray<int,int,Memory::Recycler>
                  ((int *)(pSVar10 + 1),(ulong)uVar7,(int *)(ints + 1),srcCount);
      }
      JavascriptNativeArray::SetArrayProfileInfo(this,weakFuncRef,arrayInfo);
      goto LAB_00b6c7f2;
    }
    bVar5 = (arrayInfo->field_0).bits;
  }
  if (((bVar5 & 2) != 0) ||
     (bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase), bVar4)) {
    this = (JavascriptNativeArray *)
           JavascriptLibrary::CreateArrayLiteral
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,uVar7);
    pSVar10 = (this->super_JavascriptArray).head.ptr;
    if ((uVar7 == 0) || (uVar7 != pSVar10->length)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x40f,"(count > 0 && count == head->length)",
                                  "count > 0 && count == head->length");
      if (!bVar4) {
LAB_00b6c811:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
      if (uVar7 == 0) goto LAB_00b6c7f2;
    }
    pSVar10 = pSVar10 + 1;
    uVar8 = 0;
    do {
      uVar7 = ints[uVar8 + 1].count;
      Memory::Recycler::WBSetBit((char *)pSVar10);
      uVar9 = (ulong)uVar7 | 0x1000000000000;
      pSVar10->left = (int)uVar9;
      pSVar10->length = (int)(uVar9 >> 0x20);
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pSVar10);
      uVar8 = uVar8 + 1;
      pSVar10 = (SparseArraySegmentBase *)&pSVar10->size;
    } while (srcCount != uVar8);
    goto LAB_00b6c7f2;
  }
  this = &JavascriptLibrary::CreateNativeFloatArrayLiteral
                    ((scriptContext->super_ScriptContextBase).javascriptLibrary,uVar7)->
          super_JavascriptNativeArray;
  pSVar10 = (this->super_JavascriptArray).head.ptr;
  if ((uVar7 == 0) || (uVar7 != pSVar10->length)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x403,"(count > 0 && count == head->length)",
                                "count > 0 && count == head->length");
    if (!bVar4) goto LAB_00b6c811;
    *puVar6 = 0;
    if (uVar7 != 0) goto LAB_00b6c726;
  }
  else {
LAB_00b6c726:
    uVar8 = 0;
    do {
      *(double *)(&pSVar10[1].left + uVar8 * 2) = (double)(int)ints[uVar8 + 1].count;
      uVar8 = uVar8 + 1;
    } while (srcCount != uVar8);
  }
  JavascriptNativeArray::SetArrayProfileInfo(this,weakFuncRef,arrayInfo);
LAB_00b6c7f2:
  pTVar2->noJsReentrancy = bVar1;
  return this;
}

Assistant:

Var JavascriptArray::ProfiledNewScIntArray(AuxArray<int32> *ints, ScriptContext* scriptContext, ArrayCallSiteInfo *arrayInfo, RecyclerWeakReference<FunctionBody> *weakFuncRef)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_ProfiledNewScIntArray, reentrancylock, scriptContext->GetThreadContext());
        // Called only to create array literals: size is known.
        uint32 count = ints->count;

        if (arrayInfo->IsNativeIntArray())
        {
            JavascriptNativeIntArray *arr;

#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary *lib = scriptContext->GetLibrary();
            FunctionBody *functionBody = weakFuncRef->Get();

            if (JavascriptLibrary::IsCopyOnAccessArrayCallSite(lib, arrayInfo, count))
            {
                Assert(lib->cacheForCopyOnAccessArraySegments);
                arr = scriptContext->GetLibrary()->CreateCopyOnAccessNativeIntArrayLiteral(arrayInfo, functionBody, ints);
            }
            else
#endif
            {
                arr = scriptContext->GetLibrary()->CreateNativeIntArrayLiteral(count);
                SparseArraySegment<int32> *head = SparseArraySegment<int32>::From(arr->head);
                Assert(count > 0 && count == head->length);
                CopyArray(head->elements, head->length, ints->elements, count);
            }

            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);

            return arr;
        }

        if (arrayInfo->IsNativeFloatArray())
        {
            JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(count);
            SparseArraySegment<double> *head = SparseArraySegment<double>::From(arr->head);
            Assert(count > 0 && count == head->length);
            for (uint i = 0; i < count; i++)
            {
                head->elements[i] = (double)ints->elements[i];
            }
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);

            return arr;
        }

        JavascriptArray *arr = scriptContext->GetLibrary()->CreateArrayLiteral(count);
        SparseArraySegment<Var> *head = SparseArraySegment<Var>::From(arr->head);
        Assert(count > 0 && count == head->length);

        for (uint i = 0; i < count; i++)
        {
            head->elements[i] = JavascriptNumber::ToVar(ints->elements[i], scriptContext);
        }

        return arr;
        JIT_HELPER_END(ScrArr_ProfiledNewScIntArray);
    }